

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  Config config;
  LoggingHandler<Client> logging_handler;
  ExceptionHandler<Client> exception_handler;
  HTTPHandler<Client> http_handler;
  Server<Client> server;
  Config local_22c;
  IHandler<Client> local_220;
  undefined ***local_218;
  undefined **local_210;
  HTTPHandler<Client> *local_208;
  HTTPHandler<Client> local_200;
  Server<Client> local_180;
  
  local_22c.threads_number = 100;
  local_22c.queue_size = 1000;
  local_22c.port = 0x1ed0;
  HTTPHandler<Client>::HTTPHandler(&local_200,&RESOLVE_PATH_abi_cxx11_,&CERTS_PATH_abi_cxx11_);
  local_218 = &local_210;
  local_210 = &PTR_handle_001e9a98;
  local_220._vptr_IHandler = (_func_int **)&PTR_handle_001e9ac8;
  local_208 = &local_200;
  Server<Client>::Server(&local_180,&local_220,&local_22c);
  Server<Client>::start(&local_180);
  Server<Client>::~Server(&local_180);
  HTTPHandler<Client>::~HTTPHandler(&local_200);
  return 0;
}

Assistant:

int main() {
    Server<Client>::Config config(
        THREADS_NUMBER, 
        QUEUE_SIZE,
        PORT
    );

    HTTPHandler<Client> http_handler(RESOLVE_PATH, CERTS_PATH);
    ExceptionHandler<Client> exception_handler(http_handler);
    LoggingHandler<Client> logging_handler(exception_handler);
    Server<Client> server(logging_handler, config);

    server.start();
}